

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_empty_mtree.c
# Opt level: O2

void test_empty_mtree(void)

{
  wchar_t wVar1;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_empty_mtree.c"
                      ,L'\x12',"test1.mtree",L'ǿ',L'\xffffffff',"#mtree\n");
  wVar1 = systemf("%s cf test1.tar @test1.mtree >test1.out 2>test1.err",testprog);
  failure("Error invoking %s cf",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_empty_mtree.c"
                      ,L'\x17',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_empty_mtree.c"
             ,L'\x18',"test1.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_empty_mtree.c"
             ,L'\x19',"test1.err");
  return;
}

Assistant:

DEFINE_TEST(test_empty_mtree)
{
	int r;

	assertMakeFile("test1.mtree", 0777, "#mtree\n");

	r = systemf("%s cf test1.tar @test1.mtree >test1.out 2>test1.err",
	    testprog);
	failure("Error invoking %s cf", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("test1.out");
	assertEmptyFile("test1.err");
}